

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_backend.cpp
# Opt level: O3

void __thiscall basisu::basisu_backend::basisu_backend(basisu_backend *this)

{
  (this->m_params).m_etc1s = false;
  (this->m_params).m_debug = false;
  (this->m_params).m_debug_images = false;
  (this->m_params).m_endpoint_rdo_quality_thresh = 0.0;
  (this->m_params).m_selector_rdo_quality_thresh = 0.0;
  *(undefined8 *)((long)&(this->m_params).m_selector_rdo_quality_thresh + 1) = 0;
  (this->m_params).m_validate = true;
  (this->m_slices).m_p = (basisu_backend_slice_desc *)0x0;
  (this->m_slices).m_size = 0;
  (this->m_slices).m_capacity = 0;
  basisu_backend_output::basisu_backend_output(&this->m_output);
  *(undefined8 *)((long)&(this->m_params).m_selector_rdo_quality_thresh + 1) = 0;
  (this->m_params).m_endpoint_rdo_quality_thresh = 0.0;
  (this->m_params).m_selector_rdo_quality_thresh = 0.0;
  this->m_pFront_end = (basisu_frontend *)0x0;
  *(undefined4 *)((long)&this->m_pFront_end + 7) = 0;
  memset(&this->m_endpoint_palette,0,0xa0);
  (this->m_params).m_validate = true;
  basisu_backend_output::clear(&this->m_output);
  return;
}

Assistant:

basisu_backend::basisu_backend()
	{
		clear();
	}